

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::set_reasonable_grow_cells_for_R(PeleLM *this,Real time)

{
  FabArray<amrex::FArrayBox> *this_00;
  Geometry *this_01;
  Periodicity local_20;
  
  this_00 = &amrex::AmrLevel::get_data((AmrLevel *)this,RhoYdot_Type,time)->
             super_FabArray<amrex::FArrayBox>;
  if (0 < (this_00->super_FabArrayBase).n_grow.vect[0]) {
    this_01 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    local_20 = amrex::Geometry::periodicity(this_01);
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>(this_00,0,0x15,&local_20,false);
    amrex::Extrapolater::FirstOrderExtrap
              ((MultiFab *)this_00,this_01,0,0x15,(this_00->super_FabArrayBase).n_grow.vect[0]);
  }
  return;
}

Assistant:

void
PeleLM::set_reasonable_grow_cells_for_R (Real time)
{
   //
   // Ensure reasonable grow cells for R.
   //
   MultiFab& React = get_data(RhoYdot_Type, time);
   if (React.nGrow() > 0 ) {
      React.FillBoundary(0,NUM_SPECIES, geom.periodicity());
      Extrapolater::FirstOrderExtrap(React, geom, 0, NUM_SPECIES, React.nGrow());
   }
}